

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fwrite_weight_data(NetOptimize *this,Mat *data,FILE *bp)

{
  long lVar1;
  long lVar2;
  uchar padding [4];
  Mat data_flattened;
  undefined4 local_6c;
  Mat local_68;
  
  lVar1 = ftell((FILE *)bp);
  ncnn::Mat::reshape(&local_68,data,data->h * data->w * data->c,(Allocator *)0x0);
  fwrite(local_68.data,local_68.elemsize,(long)local_68.w,(FILE *)bp);
  lVar2 = ftell((FILE *)bp);
  lVar1 = (long)((int)lVar2 - (int)lVar1);
  local_6c = 0;
  fwrite(&local_6c,1,(lVar1 + 3U & 0xfffffffffffffffc) - lVar1,(FILE *)bp);
  if (local_68.refcount != (int *)0x0) {
    LOCK();
    *local_68.refcount = *local_68.refcount + -1;
    UNLOCK();
    if (*local_68.refcount == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int NetOptimize::fwrite_weight_data(const ncnn::Mat& data, FILE* bp)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.c);
    fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    size_t nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}